

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall
ON_3dVector::Decompose
          (ON_3dVector *this,ON_3dVector *X,ON_3dVector *Y,ON_3dVector *Z,double *a,double *b,
          double *c)

{
  int iVar1;
  double d0;
  double d1;
  double d2;
  double local_a8;
  double row2 [3];
  double local_88;
  double row1 [3];
  double local_68;
  double row0 [3];
  double local_48;
  double pivot_ratio;
  double *pdStack_38;
  int rank;
  double *b_local;
  double *a_local;
  ON_3dVector *Z_local;
  ON_3dVector *Y_local;
  ON_3dVector *X_local;
  ON_3dVector *this_local;
  
  local_48 = 0.0;
  pdStack_38 = b;
  b_local = a;
  a_local = &Z->x;
  Z_local = Y;
  Y_local = X;
  X_local = this;
  local_68 = operator*(X,X);
  row0[0] = operator*(Y_local,Z_local);
  row0[1] = operator*(Y_local,(ON_3dVector *)a_local);
  local_88 = row0[0];
  row1[0] = operator*(Z_local,Z_local);
  row2[0] = operator*(Z_local,(ON_3dVector *)a_local);
  local_a8 = row0[1];
  row1[1] = row2[0];
  row2[1] = operator*((ON_3dVector *)a_local,(ON_3dVector *)a_local);
  d0 = operator*(this,Y_local);
  d1 = operator*(this,Z_local);
  d2 = operator*(this,(ON_3dVector *)a_local);
  iVar1 = ON_Solve3x3(&local_68,&local_88,&local_a8,d0,d1,d2,b_local,pdStack_38,c,&local_48);
  return (bool)(-(iVar1 == 3) & 1);
}

Assistant:

bool ON_3dVector::Decompose( // Computes a, b, c such that this vector = a*X + b*Y + c*Z
       //
       // If X,Y,Z is known to be an orthonormal frame,
       // then a = V*X, b = V*Y, c = V*Z will compute
       // the same result more quickly.
       const ON_3dVector& X,
       const ON_3dVector& Y,
       const ON_3dVector& Z,
       double* a,
       double* b,
       double* c
       ) const
{
  int rank;
  double pivot_ratio = 0.0;
  double row0[3], row1[3], row2[3];
  row0[0] = X*X;   row0[1] = X*Y;   row0[2] = X*Z;
  row1[0] = row0[1]; row1[1] = Y*Y;   row1[2] = Y*Z;
  row2[0] = row0[2]; row2[1] = row1[2]; row2[2] = Z*Z;
  rank = ON_Solve3x3( row0, row1, row2, 
                    (*this)*X, (*this)*Y, (*this)*Z,
                    a, b, c, &pivot_ratio );
  return (rank == 3) ? true : false;
}